

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FieldGeneratorTable::Build
          (FieldGeneratorTable *this,Options *options,MessageSCCAnalyzer *scc,
          Span<const_int> has_bit_indices,Span<const_int> inlined_string_indices)

{
  uint uVar1;
  bool bVar2;
  FieldDescriptor *field;
  undefined8 extraout_RAX;
  long *plVar3;
  ulong uVar4;
  ulong uVar5;
  ulong unaff_R12;
  ulong unaff_R15;
  Iterator __end3;
  Iterator local_c0;
  pointer local_b0;
  pointer local_a8;
  Options *local_a0;
  MessageSCCAnalyzer *local_98;
  Iterator local_90;
  FieldGenerator local_80;
  
  local_a8 = has_bit_indices.ptr_;
  local_a0 = options;
  local_98 = scc;
  std::
  vector<google::protobuf::compiler::cpp::FieldGenerator,_std::allocator<google::protobuf::compiler::cpp::FieldGenerator>_>
  ::reserve(&this->fields_,(long)*(int *)(this->descriptor_ + 4));
  local_c0.descriptor = this->descriptor_;
  local_c0.idx = 0;
  local_90.idx = *(int *)(local_c0.descriptor + 4);
  local_90.descriptor = local_c0.descriptor;
  bVar2 = protobuf::internal::operator==(&local_c0,&local_90);
  if (!bVar2) {
    local_b0 = inlined_string_indices.ptr_;
    do {
      field = Descriptor::field(local_c0.descriptor,local_c0.idx);
      if (((byte)field[1] & 8) == 0) {
        plVar3 = (long *)(*(long *)(field + 0x20) + 0x38);
      }
      else if (*(long *)(field + 0x28) == 0) {
        plVar3 = (long *)(*(long *)(field + 0x10) + 0x78);
      }
      else {
        plVar3 = (long *)(*(long *)(field + 0x28) + 0x60);
      }
      uVar4 = (ulong)((int)((ulong)((long)field - *plVar3) >> 3) * -0x45d1745d);
      if (has_bit_indices.len_ == 0) {
        uVar5 = 0;
      }
      else {
        if (has_bit_indices.len_ <= uVar4) {
          Build();
          goto LAB_001a1a23;
        }
        uVar1 = local_a8[uVar4];
        unaff_R15 = unaff_R15 & 0xffffffff;
        if (-1 < (int)uVar1) {
          unaff_R15 = (ulong)uVar1;
        }
        uVar5 = 0;
        if (-1 < (int)uVar1) {
          uVar5 = 0x100000000;
        }
      }
      if (inlined_string_indices.len_ == 0) {
        uVar4 = 0;
      }
      else {
        if (inlined_string_indices.len_ <= uVar4) {
LAB_001a1a23:
          Build();
          FieldGenerator::~FieldGenerator(&local_80);
          _Unwind_Resume(extraout_RAX);
        }
        uVar1 = local_b0[uVar4];
        uVar4 = 0;
        if (-1 < (int)uVar1) {
          uVar4 = 0x100000000;
        }
        unaff_R12 = unaff_R12 & 0xffffffff;
        if (-1 < (int)uVar1) {
          unaff_R12 = (ulong)uVar1;
        }
      }
      FieldGenerator::FieldGenerator
                (&local_80,field,local_a0,local_98,
                 (optional<unsigned_int>)(uVar5 | unaff_R15 & 0xffffffff),
                 (optional<unsigned_int>)(unaff_R12 & 0xffffffff | uVar4));
      std::
      vector<google::protobuf::compiler::cpp::FieldGenerator,_std::allocator<google::protobuf::compiler::cpp::FieldGenerator>_>
      ::emplace_back<google::protobuf::compiler::cpp::FieldGenerator>(&this->fields_,&local_80);
      std::
      vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
      ::~vector(&local_80.per_generator_vars_);
      std::
      vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
      ::~vector(&local_80.tracker_vars_);
      std::
      vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
      ::~vector(&local_80.field_vars_);
      if (local_80.impl_._M_t.
          super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
          .super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_false>.
          _M_head_impl !=
          (__uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
           )0x0) {
        (*(*(_func_int ***)
            local_80.impl_._M_t.
            super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
            .super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_false>.
            _M_head_impl)[1])();
      }
      local_c0.idx = local_c0.idx + 1;
      bVar2 = protobuf::internal::operator==(&local_c0,&local_90);
    } while (!bVar2);
  }
  return;
}

Assistant:

void FieldGeneratorTable::Build(
    const Options& options, MessageSCCAnalyzer* scc,
    absl::Span<const int32_t> has_bit_indices,
    absl::Span<const int32_t> inlined_string_indices) {
  // Construct all the FieldGenerators.
  fields_.reserve(static_cast<size_t>(descriptor_->field_count()));
  for (const auto* field : internal::FieldRange(descriptor_)) {
    size_t index = static_cast<size_t>(field->index());
    absl::optional<uint32_t> has_bit_index;
    if (!has_bit_indices.empty() && has_bit_indices[index] >= 0) {
      has_bit_index = static_cast<uint32_t>(has_bit_indices[index]);
    }

    absl::optional<uint32_t> inlined_string_index;
    if (!inlined_string_indices.empty() && inlined_string_indices[index] >= 0) {
      inlined_string_index =
          static_cast<uint32_t>(inlined_string_indices[index]);
    }

    fields_.push_back(FieldGenerator(field, options, scc, has_bit_index,
                                     inlined_string_index));
  }
}